

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

int __thiscall ON_BinaryArchive::Read3dmDimStyle(ON_BinaryArchive *this,ON_DimStyle **ppDimStyle)

{
  ON_DimStyle *src;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ON_DimStyle *this_00;
  
  if (ppDimStyle != (ON_DimStyle **)0x0) {
    *ppDimStyle = (ON_DimStyle *)0x0;
  }
  if ((this->m_archive_dim_style_table_status == 1) &&
     (uVar1 = this->m_archive_dim_style_table_read_index,
     this->m_archive_dim_style_table_read_index < 0xfffffffe)) {
    while (uVar3 = uVar1, uVar3 < (uint)(this->m_archive_dim_style_table).m_count) {
      this->m_archive_dim_style_table_read_index = uVar3 + 1;
      src = (this->m_archive_dim_style_table).m_a[uVar3];
      uVar1 = uVar3 + 1;
      if (src != (ON_DimStyle *)0x0) {
        bVar2 = ON_ModelComponent::ParentIdIsNotNil(&src->super_ON_ModelComponent);
        if (!bVar2) {
          this_00 = (ON_DimStyle *)operator_new(0x450);
          ON_DimStyle::ON_DimStyle(this_00,src);
          (this->m_archive_dim_style_table).m_a[uVar3] = this_00;
          ON_3dmAnnotationContext::UpdateReferencedDimStyle(&this->m_annotation_context,src,this_00)
          ;
          if (src == this->m_archive_current_dim_style) {
            this->m_archive_current_dim_style = this_00;
          }
          if (ppDimStyle == (ON_DimStyle **)0x0) {
            return 1;
          }
          *ppDimStyle = src;
          return 1;
        }
        uVar1 = this->m_archive_dim_style_table_read_index;
      }
    }
    this->m_archive_dim_style_table_read_index = 0xfffffffe;
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x2c11,"",
               "All calls to Read3dmDimStyle() must be after a single call to BeginRead3dmDimStyleTable() and before a single call to EndRead3dmDimStyleTable()."
              );
  }
  return 0;
}

Assistant:

int ON_BinaryArchive::Read3dmDimStyle(
  class ON_DimStyle** ppDimStyle
)
{
  if (nullptr != ppDimStyle)
    *ppDimStyle = nullptr;

  if (1 != m_archive_dim_style_table_status || m_archive_dim_style_table_read_index >= ON_UNSET_UINT_INDEX - 1)
  {
    ON_ERROR("All calls to Read3dmDimStyle() must be after a single call to BeginRead3dmDimStyleTable() and before a single call to EndRead3dmDimStyleTable().");
    return 0;
  }

  ON_DimStyle* dim_style = nullptr;
  while (m_archive_dim_style_table_read_index < m_archive_dim_style_table.UnsignedCount())
  {
    const unsigned int i = m_archive_dim_style_table_read_index++;
    ON_DimStyle* archive_dim_style = m_archive_dim_style_table[i];
    if (nullptr == archive_dim_style)
      continue;
    if (archive_dim_style->ParentIdIsNotNil())
      continue;

    ON_DimStyle* managed_dim_style = new ON_DimStyle(*archive_dim_style);
    m_archive_dim_style_table[i] = managed_dim_style;
    m_annotation_context.UpdateReferencedDimStyle(archive_dim_style, managed_dim_style);
    if (archive_dim_style == m_archive_current_dim_style)
      m_archive_current_dim_style = managed_dim_style;
    dim_style = archive_dim_style;
    break;
  }

  if (nullptr == dim_style)
  {
    m_archive_dim_style_table_read_index = ON_UNSET_UINT_INDEX - 1;
    return 0;
  }

  if (nullptr != ppDimStyle)
    *ppDimStyle = dim_style;

  return 1;
}